

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O2

ostream * vectorgraphics::operator<<(ostream *out,Point2D *point_2d)

{
  ostream *poVar1;
  
  std::operator<<(out,"(");
  poVar1 = std::ostream::_M_insert<double>(point_2d->x_);
  std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<double>(point_2d->y_);
  std::operator<<(poVar1,") ");
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream &out, const Point2D &point_2d) {
    out << "(" << point_2d.x_ << ", " << point_2d.y_ << ") ";
    return out;
  }